

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiDockNode::~ImGuiDockNode(ImGuiDockNode *this)

{
  int *piVar1;
  ImGuiWindow_conflict **ppIVar2;
  
  IM_DELETE<ImGuiTabBar>(this->TabBar);
  this->TabBar = (ImGuiTabBar *)0x0;
  this->ChildNodes[0] = (ImGuiDockNode *)0x0;
  this->ChildNodes[1] = (ImGuiDockNode *)0x0;
  ppIVar2 = (this->Windows).Data;
  if (ppIVar2 != (ImGuiWindow_conflict **)0x0) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
  }
  return;
}

Assistant:

ImGuiDockNode::~ImGuiDockNode()
{
    IM_DELETE(TabBar);
    TabBar = NULL;
    ChildNodes[0] = ChildNodes[1] = NULL;
}